

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  void **ppvVar1;
  _Bool connected;
  curl_chunk_end_callback p_Var2;
  Curl_easy *pCVar3;
  curl_chunk_bgn_callback p_Var4;
  CURLcode CVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 *puVar9;
  ftp_parselist_data *pfVar10;
  curl_wildcard_states cVar11;
  Curl_easy *pCVar12;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  pCVar12 = conn->data;
  if ((pCVar12->set).wildcardmatch == true) {
    do {
      switch((pCVar12->wildcard).state) {
      case CURLWC_INIT:
        goto switchD_00512c3e_caseD_1;
      case CURLWC_MATCHING:
        puVar9 = (undefined8 *)(pCVar12->wildcard).tmp;
        (pCVar12->set).fwrite_func = (curl_write_callback)puVar9[1];
        (pCVar12->set).out = (void *)puVar9[2];
        puVar9[1] = 0;
        puVar9[2] = 0;
        (pCVar12->wildcard).state = CURLWC_DOWNLOADING;
        CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar9);
        cVar11 = CURLWC_CLEAN;
        if (CVar5 != CURLE_OK) break;
        if ((pCVar12->wildcard).filelist.size == 0) {
          CVar5 = CURLE_REMOTE_FILE_NOT_FOUND;
          goto LAB_00512fad;
        }
        goto LAB_00512dab;
      case CURLWC_DOWNLOADING:
        puVar9 = (undefined8 *)((pCVar12->wildcard).filelist.head)->ptr;
        pcVar6 = curl_maprintf("%s%s",(pCVar12->wildcard).path,*puVar9);
        if (pcVar6 == (char *)0x0) {
          CVar5 = CURLE_OUT_OF_MEMORY;
          goto LAB_00513027;
        }
        (*Curl_cfree)((conn->data->state).pathbuffer);
        pCVar3 = conn->data;
        (pCVar3->state).pathbuffer = pcVar6;
        (pCVar3->state).path = pcVar6;
        Curl_infof(pCVar3,"Wildcard - START of \"%s\"\n",*puVar9);
        p_Var4 = (conn->data->set).chunk_bgn;
        if (p_Var4 != (curl_chunk_bgn_callback)0x0) {
          lVar7 = (*p_Var4)(puVar9,(pCVar12->wildcard).customptr,
                            (int)(pCVar12->wildcard).filelist.size);
          if (lVar7 == 2) {
            Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar9);
            cVar11 = CURLWC_SKIP;
            break;
          }
          if (lVar7 == 1) {
            CVar5 = CURLE_CHUNK_FAILED;
            goto LAB_00513027;
          }
        }
        cVar11 = CURLWC_SKIP;
        if (*(int *)(puVar9 + 1) == 0) {
          if ((*(byte *)(puVar9 + 0xc) & 0x40) != 0) {
            (conn->proto).ftpc.known_filesize = puVar9[5];
          }
          CVar5 = ftp_parse_url_path(conn);
          if (CVar5 != CURLE_OK) goto LAB_00513027;
          CVar5 = CURLE_OK;
          Curl_llist_remove(&(pCVar12->wildcard).filelist,(pCVar12->wildcard).filelist.head,
                            (void *)0x0);
          if ((pCVar12->wildcard).filelist.size != 0) goto LAB_00513027;
LAB_00512fad:
          cVar11 = CURLWC_CLEAN;
          goto LAB_0051301f;
        }
        break;
      case CURLWC_CLEAN:
        puVar9 = (undefined8 *)(pCVar12->wildcard).tmp;
        if (puVar9 == (undefined8 *)0x0) {
          CVar5 = CURLE_OK;
          cVar11 = CURLWC_DONE;
        }
        else {
          CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar9);
          cVar11 = (CVar5 == CURLE_OK) + CURLWC_ERROR;
        }
        goto LAB_0051301f;
      case CURLWC_SKIP:
        p_Var2 = (pCVar12->set).chunk_end;
        if (p_Var2 != (curl_chunk_end_callback)0x0) {
          (*p_Var2)((pCVar12->wildcard).customptr);
        }
        Curl_llist_remove(&(pCVar12->wildcard).filelist,(pCVar12->wildcard).filelist.head,
                          (void *)0x0);
        cVar11 = ((pCVar12->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
        break;
      default:
        CVar5 = CURLE_OK;
        goto LAB_00513027;
      }
      (pCVar12->wildcard).state = cVar11;
LAB_00512dab:
      pCVar12 = conn->data;
    } while( true );
  }
  CVar5 = ftp_parse_url_path(conn);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  pCVar12 = conn->data;
  goto LAB_00513049;
switchD_00512c3e_caseD_1:
  pcVar6 = (pCVar12->state).path;
  pcVar8 = strrchr(pcVar6,0x2f);
  if (pcVar8 == (char *)0x0) {
    if (*pcVar6 != '\0') {
      pcVar8 = (*Curl_cstrdup)(pcVar6);
      (pCVar12->wildcard).pattern = pcVar8;
      goto LAB_00512ec5;
    }
LAB_00512f84:
    (pCVar12->wildcard).state = CURLWC_CLEAN;
    CVar5 = ftp_parse_url_path(conn);
    goto LAB_00513005;
  }
  if (pcVar8[1] == '\0') goto LAB_00512f84;
  pcVar6 = pcVar8 + 1;
  pcVar8 = (*Curl_cstrdup)(pcVar6);
  (pCVar12->wildcard).pattern = pcVar8;
LAB_00512ec5:
  if (pcVar8 == (char *)0x0) {
LAB_00512fff:
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *pcVar6 = '\0';
    puVar9 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
    if (puVar9 == (undefined8 *)0x0) {
      (*Curl_cfree)((pCVar12->wildcard).pattern);
      (pCVar12->wildcard).pattern = (char *)0x0;
      goto LAB_00512fff;
    }
    pfVar10 = Curl_ftp_parselist_data_alloc();
    *puVar9 = pfVar10;
    if (pfVar10 == (ftp_parselist_data *)0x0) {
      (*Curl_cfree)((pCVar12->wildcard).pattern);
      (pCVar12->wildcard).pattern = (char *)0x0;
      (*Curl_cfree)(puVar9);
      goto LAB_00512fff;
    }
    (pCVar12->wildcard).tmp = puVar9;
    (pCVar12->wildcard).tmp_dtor = wc_data_dtor;
    if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
      (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
    }
    ppvVar1 = &(pCVar12->wildcard).tmp;
    CVar5 = ftp_parse_url_path(conn);
    if (CVar5 == CURLE_OK) {
      pcVar6 = (*Curl_cstrdup)((conn->data->state).path);
      (pCVar12->wildcard).path = pcVar6;
      if (pcVar6 == (char *)0x0) {
        (*Curl_cfree)((pCVar12->wildcard).pattern);
        (pCVar12->wildcard).pattern = (char *)0x0;
        (*(pCVar12->wildcard).tmp_dtor)((pCVar12->wildcard).tmp);
        *ppvVar1 = (void *)0x0;
        (pCVar12->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
        goto LAB_00512fff;
      }
      pCVar3 = conn->data;
      puVar9[1] = (pCVar3->set).fwrite_func;
      (pCVar3->set).fwrite_func = Curl_ftp_parselist;
      puVar9[2] = (pCVar3->set).out;
      (pCVar3->set).out = conn;
      CVar5 = CURLE_OK;
      Curl_infof(pCVar3,"Wildcard - Parsing started\n");
    }
    else {
      (*Curl_cfree)((pCVar12->wildcard).pattern);
      (pCVar12->wildcard).pattern = (char *)0x0;
      (*(pCVar12->wildcard).tmp_dtor)((pCVar12->wildcard).tmp);
      *ppvVar1 = (void *)0x0;
      (pCVar12->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
    }
  }
LAB_00513005:
  if ((pCVar12->wildcard).state != CURLWC_CLEAN) {
    cVar11 = (uint)(CVar5 != CURLE_OK) * 4 + CURLWC_MATCHING;
LAB_0051301f:
    (pCVar12->wildcard).state = cVar11;
  }
LAB_00513027:
  pCVar12 = conn->data;
  if (((pCVar12->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
LAB_00513049:
  (pCVar12->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar12,0);
  Curl_pgrsSetDownloadCounter(pCVar12,0);
  Curl_pgrsSetUploadSize(pCVar12,-1);
  Curl_pgrsSetDownloadSize(pCVar12,-1);
  (conn->proto).ftpc.ctl_valid = true;
  if ((conn->data->set).opt_no_body == true) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x18) = 1;
  }
  *done = false;
  CVar5 = ftp_state_quote(conn,true,FTP_QUOTE);
  if (CVar5 == CURLE_OK) {
    CVar5 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    *done = (conn->proto).ftpc.state == FTP_STOP;
    connected = (conn->bits).tcpconnect[1];
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    if (CVar5 == CURLE_OK) {
      if (*done == true) {
        CVar5 = ftp_dophase_done(conn,connected);
        return CVar5;
      }
      return CURLE_OK;
    }
  }
  freedirs(&(conn->proto).ftpc);
  return CVar5;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->set.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}